

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

Maybe<char> __thiscall
kj::anon_unknown_55::tryParseInteger<char>(anon_unknown_55 *this,StringPtr *s)

{
  char cVar1;
  Maybe<long_long> local_38;
  long local_28;
  longlong max;
  longlong min;
  StringPtr *s_local;
  
  min = (longlong)s;
  s_local = (StringPtr *)this;
  cVar1 = MinValue_::operator_cast_to_char((MinValue_ *)&minValue);
  max = (longlong)cVar1;
  cVar1 = MaxValue_::operator_cast_to_char((MaxValue_ *)&maxValue);
  local_28 = (long)cVar1;
  tryParseSigned((anon_unknown_55 *)&local_38,(StringPtr *)min,max,local_28);
  Maybe<char>::Maybe<long_long>((Maybe<char> *)this,&local_38);
  Maybe<long_long>::~Maybe(&local_38);
  return (Maybe<char>)SUB82(this,0);
}

Assistant:

Maybe<T> tryParseInteger(const StringPtr& s) {
  if (static_cast<T>(minValue) < 0) {
    long long min = static_cast<T>(minValue);
    long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseSigned(s, min, max));
  } else {
    unsigned long long max = static_cast<T>(maxValue);
    return static_cast<Maybe<T>>(tryParseUnsigned(s, max));
  }
}